

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

DdNode * Extra_bddBitsToCube(DdManager *dd,int Code,int CodeWidth,DdNode **pbVars,int fMsbFirst)

{
  DdNode **ppDVar1;
  DdNode *n;
  uint uVar2;
  DdNode *f;
  uint uVar3;
  ulong uVar4;
  
  n = dd->one;
  Cudd_Ref(n);
  if (0 < CodeWidth) {
    uVar3 = CodeWidth - 1;
    uVar4 = 0;
    f = n;
    do {
      ppDVar1 = pbVars;
      if (pbVars == (DdNode **)0x0) {
        ppDVar1 = dd->vars;
      }
      uVar2 = uVar3;
      if (fMsbFirst == 0) {
        uVar2 = (uint)uVar4;
      }
      n = Cudd_bddAnd(dd,f,(DdNode *)
                           ((ulong)(((uint)~Code >> (uVar2 & 0x1f) & 1) != 0) ^
                           (ulong)ppDVar1[uVar4]));
      Cudd_Ref(n);
      Cudd_RecursiveDeref(dd,f);
      uVar4 = uVar4 + 1;
      uVar3 = uVar3 - 1;
      f = n;
    } while ((uint)CodeWidth != uVar4);
  }
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode * Extra_bddBitsToCube( DdManager * dd, int Code, int CodeWidth, DdNode ** pbVars, int fMsbFirst )
{
    int z;
    DdNode * bTemp, * bVar, * bVarBdd, * bResult;

    bResult = b1;   Cudd_Ref( bResult );
    for ( z = 0; z < CodeWidth; z++ )
    {
        bVarBdd = (pbVars)? pbVars[z]: dd->vars[z];
        if ( fMsbFirst )
            bVar = Cudd_NotCond( bVarBdd, (Code & (1 << (CodeWidth-1-z)))==0 );
        else
            bVar = Cudd_NotCond( bVarBdd, (Code & (1 << (z)))==0 );
        bResult = Cudd_bddAnd( dd, bTemp = bResult, bVar );     Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bResult );

    return bResult;
}